

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void proto2_unittest::TestRepeatedScalarDifferentTagSizes::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  TestRepeatedScalarDifferentTagSizes **v1;
  TestRepeatedScalarDifferentTagSizes **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  RepeatedField<unsigned_int> *this;
  RepeatedField<unsigned_int> *other;
  RepeatedField<int> *this_00;
  RepeatedField<int> *other_00;
  RepeatedField<unsigned_long> *pRVar2;
  RepeatedField<unsigned_long> *pRVar3;
  RepeatedField<long> *this_01;
  RepeatedField<long> *other_01;
  RepeatedField<float> *this_02;
  RepeatedField<float> *other_02;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  TestRepeatedScalarDifferentTagSizes *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  TestRepeatedScalarDifferentTagSizes *from;
  TestRepeatedScalarDifferentTagSizes *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (TestRepeatedScalarDifferentTagSizes *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (TestRepeatedScalarDifferentTagSizes *)to_msg;
  _this = (TestRepeatedScalarDifferentTagSizes *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestRepeatedScalarDifferentTagSizes_const*>(&local_38)
  ;
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestRepeatedScalarDifferentTagSizes*>(&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::TestRepeatedScalarDifferentTagSizes_const*,proto2_unittest::TestRepeatedScalarDifferentTagSizes*>
                       (v1,v2,"&from != _this");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest.pb.cc"
               ,0x9e7f,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  this = _internal_mutable_repeated_fixed32(from);
  other = _internal_repeated_fixed32
                    ((TestRepeatedScalarDifferentTagSizes *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom(this,other);
  this_00 = _internal_mutable_repeated_int32(from);
  other_00 = _internal_repeated_int32
                       ((TestRepeatedScalarDifferentTagSizes *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<int>::MergeFrom(this_00,other_00);
  pRVar2 = _internal_mutable_repeated_fixed64(from);
  pRVar3 = _internal_repeated_fixed64
                     ((TestRepeatedScalarDifferentTagSizes *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom(pRVar2,pRVar3);
  this_01 = _internal_mutable_repeated_int64(from);
  other_01 = _internal_repeated_int64
                       ((TestRepeatedScalarDifferentTagSizes *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<long>::MergeFrom(this_01,other_01);
  this_02 = _internal_mutable_repeated_float(from);
  other_02 = _internal_repeated_float
                       ((TestRepeatedScalarDifferentTagSizes *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<float>::MergeFrom(this_02,other_02);
  pRVar2 = _internal_mutable_repeated_uint64(from);
  pRVar3 = _internal_repeated_uint64
                     ((TestRepeatedScalarDifferentTagSizes *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom(pRVar2,pRVar3);
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)(absl_log_internal_check_op_result + 8));
  return;
}

Assistant:

void TestRepeatedScalarDifferentTagSizes::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestRepeatedScalarDifferentTagSizes*>(&to_msg);
  auto& from = static_cast<const TestRepeatedScalarDifferentTagSizes&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestRepeatedScalarDifferentTagSizes)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_fixed32()->MergeFrom(from._internal_repeated_fixed32());
  _this->_internal_mutable_repeated_int32()->MergeFrom(from._internal_repeated_int32());
  _this->_internal_mutable_repeated_fixed64()->MergeFrom(from._internal_repeated_fixed64());
  _this->_internal_mutable_repeated_int64()->MergeFrom(from._internal_repeated_int64());
  _this->_internal_mutable_repeated_float()->MergeFrom(from._internal_repeated_float());
  _this->_internal_mutable_repeated_uint64()->MergeFrom(from._internal_repeated_uint64());
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}